

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateStructHashSum
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *structName,
          vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
          *members)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  pointer pbVar4;
  string *psVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pMVar11;
  char *__s;
  string hashSum;
  size_type *local_e8;
  size_type local_d8;
  undefined8 uStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  pointer local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  pMVar11 = (members->
            super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (members->
             super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_68 = structName;
  local_40 = __return_storage_ptr__;
  if (pMVar11 != local_38) {
    paVar1 = &local_a8.field_2;
    do {
      pbVar7 = (pMVar11->arraySizes).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (pMVar11->arraySizes).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar7 == pbVar2) {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&(pMVar11->type).type,"char");
        if (iVar6 == 0) {
          pbVar7 = (pMVar11->lenExpressions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (pMVar11->lenExpressions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar7 != pbVar2) {
            uVar8 = (long)pbVar2 - (long)pbVar7;
            if (0x40 < uVar8) {
              __assert_fail("member.lenExpressions.size() < 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x2d7a,
                            "std::string VulkanHppGenerator::generateStructHashSum(const std::string &, const std::vector<MemberData> &) const"
                           );
            }
            if (uVar8 == 0x20) {
              iVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (pbVar7,"null-terminated");
              if (iVar6 != 0) {
                __assert_fail("member.lenExpressions[0] == \"null-terminated\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x2d7d,
                              "std::string VulkanHppGenerator::generateStructHashSum(const std::string &, const std::vector<MemberData> &) const"
                             );
              }
              std::operator+(&local_88,"    for ( const char* p = ",local_68);
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_88,".");
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar7->_M_dataplus)._M_p;
              paVar10 = &pbVar7->field_2;
              if (paVar9 == paVar10) {
                local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              }
              else {
                local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_c8._M_dataplus._M_p = (pointer)paVar9;
              }
              local_c8._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_c8,(pMVar11->name)._M_dataplus._M_p,
                                  (pMVar11->name)._M_string_length);
              local_a8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p == paVar9) {
                local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_a8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_a8._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_a8,"; *p != \'\\0\'; ++p )\n");
              local_e8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8 == paVar9) {
                local_d8 = paVar9->_M_allocated_capacity;
                uStack_d0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_e8 = &local_d8;
              }
              else {
                local_d8 = paVar9->_M_allocated_capacity;
              }
              sVar3 = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_60,(char *)local_e8,sVar3);
              if (local_e8 != &local_d8) {
                operator_delete(local_e8,local_d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar1) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_60,"    {\n");
              __s = "      VULKAN_HPP_HASH_COMBINE( seed, *p );\n";
            }
            else {
              iVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (pbVar7 + 1,"null-terminated");
              if (iVar6 != 0) {
                __assert_fail("member.lenExpressions[1] == \"null-terminated\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x2d85,
                              "std::string VulkanHppGenerator::generateStructHashSum(const std::string &, const std::vector<MemberData> &) const"
                             );
              }
              std::operator+(&local_88,"    for ( size_t i = 0; i < ",local_68);
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_88,".");
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar7->_M_dataplus)._M_p;
              paVar10 = &pbVar7->field_2;
              if (paVar9 == paVar10) {
                local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              }
              else {
                local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_c8._M_dataplus._M_p = (pointer)paVar9;
              }
              local_c8._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar4 = (pMVar11->lenExpressions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_c8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
              local_a8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p == paVar9) {
                local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_a8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_a8._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_a8,"; ++i )\n");
              local_e8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8 == paVar9) {
                local_d8 = paVar9->_M_allocated_capacity;
                uStack_d0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_e8 = &local_d8;
              }
              else {
                local_d8 = paVar9->_M_allocated_capacity;
              }
              sVar3 = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_60,(char *)local_e8,sVar3);
              if (local_e8 != &local_d8) {
                operator_delete(local_e8,local_d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar1) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_60,"    {\n");
              std::operator+(&local_88,"        for ( const char* p = ",local_68);
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_88,".");
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar7->_M_dataplus)._M_p;
              paVar10 = &pbVar7->field_2;
              if (paVar9 == paVar10) {
                local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              }
              else {
                local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_c8._M_dataplus._M_p = (pointer)paVar9;
              }
              local_c8._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_c8,(pMVar11->name)._M_dataplus._M_p,
                                  (pMVar11->name)._M_string_length);
              local_a8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p == paVar9) {
                local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_a8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_a8._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_a8,"[i]; *p != \'\\0\'; ++p )\n");
              local_e8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8 == paVar9) {
                local_d8 = paVar9->_M_allocated_capacity;
                uStack_d0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_e8 = &local_d8;
              }
              else {
                local_d8 = paVar9->_M_allocated_capacity;
              }
              sVar3 = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_60,(char *)local_e8,sVar3);
              if (local_e8 != &local_d8) {
                operator_delete(local_e8,local_d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar1) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_60,"        {\n");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_60,"          VULKAN_HPP_HASH_COMBINE( seed, *p );\n");
              __s = "        }\n";
            }
            goto LAB_001a8c58;
          }
        }
        std::operator+(&local_88,"    VULKAN_HPP_HASH_COMBINE( seed, ",local_68);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_88,".");
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar10 = &pbVar7->field_2;
        if (paVar9 == paVar10) {
          local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_c8._M_dataplus._M_p = (pointer)paVar9;
        }
        local_c8._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_c8,(pMVar11->name)._M_dataplus._M_p,
                           (pMVar11->name)._M_string_length);
        local_a8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar9 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p == paVar9) {
          local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_a8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_a8._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_a8," );\n");
        local_e8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
        paVar9 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8 == paVar9) {
          local_d8 = paVar9->_M_allocated_capacity;
          uStack_d0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_e8 = &local_d8;
        }
        else {
          local_d8 = paVar9->_M_allocated_capacity;
        }
        sVar3 = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_60,(char *)local_e8,sVar3);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (0x40 < (ulong)((long)pbVar2 - (long)pbVar7)) {
          __assert_fail("member.arraySizes.size() < 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x2d68,
                        "std::string VulkanHppGenerator::generateStructHashSum(const std::string &, const std::vector<MemberData> &) const"
                       );
        }
        std::operator+(&local_a8,"    for ( size_t i = 0; i < ",pbVar7);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_a8,"; ++i )\n");
        local_e8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
        paVar9 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8 == paVar9) {
          local_d8 = paVar9->_M_allocated_capacity;
          uStack_d0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_e8 = &local_d8;
        }
        else {
          local_d8 = paVar9->_M_allocated_capacity;
        }
        sVar3 = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_60,(char *)local_e8,sVar3);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_60,"    {\n");
        pbVar4 = (pMVar11->arraySizes).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)(pMVar11->arraySizes).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 == 0x20) {
          std::operator+(&local_88,"      VULKAN_HPP_HASH_COMBINE( seed, ",local_68);
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_88,".");
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar7->_M_dataplus)._M_p;
          paVar10 = &pbVar7->field_2;
          if (paVar9 == paVar10) {
            local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          }
          else {
            local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_c8._M_dataplus._M_p = (pointer)paVar9;
          }
          local_c8._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_c8,(pMVar11->name)._M_dataplus._M_p,
                             (pMVar11->name)._M_string_length);
          local_a8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p == paVar9) {
            local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_a8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          local_a8._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_a8,"[i] );\n");
          local_e8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8 == paVar9) {
            local_d8 = paVar9->_M_allocated_capacity;
            uStack_d0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_e8 = &local_d8;
          }
          else {
            local_d8 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_60,(char *)local_e8,sVar3);
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::operator+(&local_a8,"      for ( size_t j=0; j < ",pbVar4 + 1);
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_a8,"; ++j )\n");
          local_e8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8 == paVar9) {
            local_d8 = paVar9->_M_allocated_capacity;
            uStack_d0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_e8 = &local_d8;
          }
          else {
            local_d8 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_60,(char *)local_e8,sVar3);
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_60,"      {\n");
          std::operator+(&local_88,"        VULKAN_HPP_HASH_COMBINE( seed, ",local_68);
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_88,".");
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar7->_M_dataplus)._M_p;
          paVar10 = &pbVar7->field_2;
          if (paVar9 == paVar10) {
            local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          }
          else {
            local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_c8._M_dataplus._M_p = (pointer)paVar9;
          }
          local_c8._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_c8,(pMVar11->name)._M_dataplus._M_p,
                             (pMVar11->name)._M_string_length);
          local_a8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p == paVar9) {
            local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_a8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_a8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          local_a8._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_a8,"[i][j] );\n");
          local_e8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8 == paVar9) {
            local_d8 = paVar9->_M_allocated_capacity;
            uStack_d0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_e8 = &local_d8;
          }
          else {
            local_d8 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_60,(char *)local_e8,sVar3);
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          __s = "      }\n";
LAB_001a8c58:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_60,__s);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_60,"    }\n");
      }
      psVar5 = local_40;
      pMVar11 = pMVar11 + 1;
    } while (pMVar11 != local_38);
    if (local_60._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (local_40,&local_60,0,local_60._M_string_length - 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      return psVar5;
    }
  }
  __assert_fail("!hashSum.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x2d94,
                "std::string VulkanHppGenerator::generateStructHashSum(const std::string &, const std::vector<MemberData> &) const"
               );
}

Assistant:

std::string VulkanHppGenerator::generateStructHashSum( std::string const & structName, std::vector<MemberData> const & members ) const
{
  std::string hashSum;
  for ( auto const & member : members )
  {
    if ( !member.arraySizes.empty() )
    {
      assert( member.arraySizes.size() < 3 );
      hashSum += "    for ( size_t i = 0; i < " + member.arraySizes[0] + "; ++i )\n";
      hashSum += "    {\n";
      if ( member.arraySizes.size() == 1 )
      {
        hashSum += "      VULKAN_HPP_HASH_COMBINE( seed, " + structName + "." + member.name + "[i] );\n";
      }
      else
      {
        hashSum += "      for ( size_t j=0; j < " + member.arraySizes[1] + "; ++j )\n";
        hashSum += "      {\n";
        hashSum += "        VULKAN_HPP_HASH_COMBINE( seed, " + structName + "." + member.name + "[i][j] );\n";
        hashSum += "      }\n";
      }
      hashSum += "    }\n";
    }
    else if ( member.type.type == "char" && !member.lenExpressions.empty() )
    {
      assert( member.lenExpressions.size() < 3 );
      if ( member.lenExpressions.size() == 1 )
      {
        assert( member.lenExpressions[0] == "null-terminated" );
        hashSum += "    for ( const char* p = " + structName + "." + member.name + "; *p != '\\0'; ++p )\n";
        hashSum += "    {\n";
        hashSum += "      VULKAN_HPP_HASH_COMBINE( seed, *p );\n";
        hashSum += "    }\n";
      }
      else
      {
        assert( member.lenExpressions[1] == "null-terminated" );
        hashSum += "    for ( size_t i = 0; i < " + structName + "." + member.lenExpressions[0] + "; ++i )\n";
        hashSum += "    {\n";
        hashSum += "        for ( const char* p = " + structName + "." + member.name + "[i]; *p != '\\0'; ++p )\n";
        hashSum += "        {\n";
        hashSum += "          VULKAN_HPP_HASH_COMBINE( seed, *p );\n";
        hashSum += "        }\n";
        hashSum += "    }\n";
      }
    }
    else
    {
      hashSum += "    VULKAN_HPP_HASH_COMBINE( seed, " + structName + "." + member.name + " );\n";
    }
  }
  assert( !hashSum.empty() );
  return hashSum.substr( 0, hashSum.size() - 1 );
}